

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_helpers.cc
# Opt level: O1

string * __thiscall
google::protobuf::compiler::java::GenerateGetBit_abi_cxx11_
          (string *__return_storage_ptr__,java *this,int bitIndex)

{
  string local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"");
  anon_unknown_0::GenerateGetBitInternal(__return_storage_ptr__,&local_40,(int)this);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

string GenerateGetBit(int bitIndex) {
  return GenerateGetBitInternal("", bitIndex);
}